

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

QSqlField * __thiscall
QList<QSqlField>::value(QSqlField *__return_storage_ptr__,QList<QSqlField> *this,qsizetype i)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_78;
  QSqlField local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.d = (Data *)0x0;
  local_78.ptr = (char16_t *)0x0;
  local_78.size = 0;
  local_98.d = (Data *)0x0;
  local_98.ptr = (char16_t *)0x0;
  local_98.size = 0;
  QSqlField::QSqlField(&local_60,(QString *)&local_78,(QMetaType)0x0,(QString *)&local_98);
  value(__return_storage_ptr__,this,i,&local_60);
  QSqlField::~QSqlField(&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

T value(qsizetype i) const { return value(i, T()); }